

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

void google::protobuf::util::FieldMaskUtil::FromString(string_view str,FieldMask *out)

{
  bool bVar1;
  reference pbVar2;
  char in_R8B;
  ConvertibleToStringView text;
  undefined1 local_98 [8];
  string_view path;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  ConvertibleToStringView local_60;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  undefined1 local_38 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  paths;
  FieldMask *out_local;
  string_view str_local;
  
  paths.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)out;
  FieldMask::Clear(out);
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_60,str);
  text.value_._M_str = (char *)0x2c;
  text.value_._M_len = (size_t)local_60.value_._M_str;
  absl::lts_20250127::StrSplit<char>(&local_50,(lts_20250127 *)local_60.value_._M_len,text,in_R8B);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_38,&local_50);
  __end2 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_38);
  path._M_str = (char *)std::
                        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)&path._M_str), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end2);
    local_98 = (undefined1  [8])pbVar2->_M_len;
    path._M_len = (size_t)pbVar2->_M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_98);
    if (!bVar1) {
      FieldMask::add_paths<std::basic_string_view<char,std::char_traits<char>>&>
                ((FieldMask *)
                 paths.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_98);
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void FieldMaskUtil::FromString(absl::string_view str, FieldMask* out) {
  out->Clear();
  std::vector<absl::string_view> paths = absl::StrSplit(str, ',');
  for (absl::string_view path : paths) {
    if (path.empty()) continue;
    out->add_paths(path);
  }
}